

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O2

int scope_metadata_array_cb_iterate_counter
              (set s,set_key key,set_value val,set_cb_iterate_args args)

{
  type_id tVar1;
  long lStack_10;
  
  tVar1 = value_type_id(val);
  if (tVar1 == 0xd) {
    lStack_10 = 0x18;
  }
  else if (tVar1 == 0x10) {
    lStack_10 = 0x28;
  }
  else {
    if (tVar1 != 0xf) {
      return 0;
    }
    lStack_10 = 0x20;
  }
  *(long *)((long)args + lStack_10) = *(long *)((long)args + lStack_10) + 1;
  return 0;
}

Assistant:

int scope_metadata_array_cb_iterate_counter(set s, set_key key, set_value val, set_cb_iterate_args args)
{
	scope_metadata_array_cb_iterator metadata_iterator = (scope_metadata_array_cb_iterator)args;

	(void)s;
	(void)key;

	type_id id = value_type_id(val);

	if (id == TYPE_FUNCTION)
	{
		metadata_iterator->functions_size++;
	}
	else if (id == TYPE_CLASS)
	{
		metadata_iterator->classes_size++;
	}
	else if (id == TYPE_OBJECT)
	{
		metadata_iterator->objects_size++;
	}

	return 0;
}